

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::~BlitFboCase(BlitFboCase *this)

{
  ~BlitFboCase(this);
  operator_delete(this,0x100);
  return;
}

Assistant:

BlitFboCase::~BlitFboCase (void)
{
	deinit();
}